

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createMaterial_uber(SemanticParser *this,SP *in)

{
  string *name_00;
  element_type *this_00;
  element_type *this_01;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  runtime_error *prVar5;
  long *plVar6;
  element_type *peVar7;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Rb_tree_node_base *p_Var9;
  vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_> *result;
  _Base_ptr this_02;
  _Rb_tree_node_base *p_Var10;
  float fVar11;
  undefined1 auVar12 [16];
  SP SVar13;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  undefined1 local_158 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  _Base_ptr local_48;
  _Base_ptr local_38;
  
  local_158._24_8_ = in;
  local_158._32_8_ = this;
  std::__shared_ptr<pbrt::UberMaterial,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::UberMaterial>,std::__cxx11::string&>
            ((__shared_ptr<pbrt::UberMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_178,
             (allocator<pbrt::UberMaterial> *)&local_110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  p_Var10 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var9 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var8._M_pi = extraout_RDX;
  if (p_Var10 != p_Var9) {
    name_00 = (string *)(local_158 + 0x28);
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_110,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var10 + 1));
      local_158._40_8_ = &local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)name_00,local_110.first._M_dataplus._M_p,
                 local_110.first._M_dataplus._M_p +
                 (long)(_Rb_tree_color *)local_110.first._M_string_length);
      iVar4 = std::__cxx11::string::compare((char *)name_00);
      if (iVar4 == 0) {
        bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
        if (!bVar3) {
          result = (vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                    *)&(local_178->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
LAB_001425c2:
          syntactic::ParamSet::getParam3f((ParamSet *)*in_RDX,(float *)result,name_00);
          goto LAB_001427bf;
        }
        (local_178->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
        *(undefined4 *)
         &(local_178->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = 0x3f800000;
        syntactic::ParamSet::getParamTexture((ParamSet *)&stack0xffffffffffffffc0,(string *)*in_RDX)
        ;
        findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
        _Var8._M_pi = _Stack_160._M_pi;
        peVar7 = local_168;
        local_168 = (element_type *)0x0;
        _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar1 = (local_178->integrator).
                 super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (local_178->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
        (local_178->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)_Var8._M_pi;
        this_02 = local_38;
        if ((peVar1 != (element_type *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1), this_02 = local_38,
           (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
          this_02 = local_38;
        }
LAB_001427b5:
        if (this_02 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)name_00);
        if (iVar4 == 0) {
          bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
          if (!bVar3) {
            result = (vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      *)&(local_178->world).
                         super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            goto LAB_001425c2;
          }
          (local_178->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
          *(undefined4 *)&local_178[1].super_Entity._vptr_Entity = 0x3f800000;
          syntactic::ParamSet::getParamTexture((ParamSet *)(local_60 + 0x10),(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
          _Var8._M_pi = _Stack_160._M_pi;
          peVar7 = local_168;
          local_168 = (element_type *)0x0;
          _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_178[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>.
                           _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> +
                   8))->_M_pi;
          local_178[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &peVar7->super_Entity;
          ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&local_178[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this
                  .super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
               _Var8._M_pi;
          this_02 = local_48;
          if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
             this_02 = local_48, (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
            this_02 = local_48;
          }
          goto LAB_001427b5;
        }
        iVar4 = std::__cxx11::string::compare((char *)name_00);
        if (iVar4 == 0) {
          bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
          if (!bVar3) {
            result = &local_178[1].cameras;
            goto LAB_001425c2;
          }
          local_178[1].cameras.
          super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
          *(undefined4 *)
           ((long)&local_178[1].cameras.
                   super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                   ._M_impl.super__Vector_impl_data + 8) = 0x3f800000;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_60,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
          _Var8._M_pi = _Stack_160._M_pi;
          peVar7 = local_168;
          local_168 = (element_type *)0x0;
          _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = local_178[1].film.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          *(element_type **)
           ((long)&local_178[1].cameras.
                   super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = peVar7;
          local_178[1].film.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Var8._M_pi;
          this_02 = (_Base_ptr)local_60._8_8_;
          if ((this_00 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
             this_02 = (_Base_ptr)local_60._8_8_,
             (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
            this_02 = (_Base_ptr)local_60._8_8_;
          }
          goto LAB_001427b5;
        }
        iVar4 = std::__cxx11::string::compare((char *)name_00);
        if (iVar4 == 0) {
          bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
          if (!bVar3) {
            result = (vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      *)&(local_178->integrator).
                         super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
            goto LAB_001425c2;
          }
          (local_178->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
          *(undefined4 *)
           &(local_178->pixelFilter).
            super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x3f800000;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_70,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
          _Var8._M_pi = _Stack_160._M_pi;
          peVar7 = local_168;
          local_168 = (element_type *)0x0;
          _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_01 = (local_178->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          (local_178->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
          (local_178->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Var8._M_pi;
          this_02 = (_Base_ptr)local_70._8_8_;
          if ((this_01 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
             this_02 = (_Base_ptr)local_70._8_8_,
             (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
            this_02 = (_Base_ptr)local_70._8_8_;
          }
          goto LAB_001427b5;
        }
        iVar4 = std::__cxx11::string::compare((char *)name_00);
        if (iVar4 == 0) {
          bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
          if (!bVar3) {
            fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,name_00,0.0);
            *(float *)&local_178[1].integrator.
                       super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi = fVar11;
            goto LAB_001427bf;
          }
          *(undefined4 *)
           &local_178[1].integrator.super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = 0x3f800000;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_80,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
          _Var8._M_pi = _Stack_160._M_pi;
          peVar7 = local_168;
          local_168 = (element_type *)0x0;
          _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = local_178[1].pixelFilter.
                   super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          local_178[1].pixelFilter.super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)peVar7;
          local_178[1].pixelFilter.super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Var8._M_pi;
          this_02 = (_Base_ptr)local_80._8_8_;
          if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
             this_02 = (_Base_ptr)local_80._8_8_,
             (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
            this_02 = (_Base_ptr)local_80._8_8_;
          }
          goto LAB_001427b5;
        }
        iVar4 = std::__cxx11::string::compare((char *)name_00);
        if (iVar4 == 0) {
          bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
          if (!bVar3) {
            result = (vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      *)&local_178[1].film.
                         super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            goto LAB_001425c2;
          }
          local_178[1].film.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
          *(undefined4 *)
           &local_178[1].sampler.super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = 0x3f800000;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_90,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
          _Var8._M_pi = _Stack_160._M_pi;
          peVar7 = local_168;
          local_168 = (element_type *)0x0;
          _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          peVar1 = local_178[1].integrator.
                   super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_178[1].sampler.super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
          local_178[1].integrator.super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)_Var8._M_pi;
          this_02 = (_Base_ptr)local_90._8_8_;
          if ((peVar1 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1),
             this_02 = (_Base_ptr)local_90._8_8_,
             (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
            this_02 = (_Base_ptr)local_90._8_8_;
          }
          goto LAB_001427b5;
        }
        iVar4 = std::__cxx11::string::compare((char *)name_00);
        if (iVar4 == 0) {
          fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,name_00,0.0);
          *(float *)&local_178[2].super_Entity.super_enable_shared_from_this<pbrt::Entity>.
                     _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = fVar11;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)name_00);
          if (iVar4 == 0) {
            bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
            if (bVar3) {
              syntactic::ParamSet::getParamTexture((ParamSet *)local_a0,(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
              _Var8._M_pi = _Stack_160._M_pi;
              peVar7 = local_168;
              local_168 = (element_type *)0x0;
              _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var2 = local_178[2].sampler.
                       super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              local_178[2].sampler.super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)peVar7;
              local_178[2].sampler.super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = _Var8._M_pi;
              this_02 = (_Base_ptr)local_a0._8_8_;
              if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                 this_02 = (_Base_ptr)local_a0._8_8_,
                 (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
                this_02 = (_Base_ptr)local_a0._8_8_;
              }
              goto LAB_001427b5;
            }
            bVar3 = syntactic::ParamSet::hasParam1f((ParamSet *)*in_RDX,name_00);
            if (!bVar3) {
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar5,"uber::roughness in un-recognized format...")
              ;
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,name_00,0.0);
            *(float *)((long)&local_178[2].super_Entity.super_enable_shared_from_this<pbrt::Entity>.
                              _M_weak_this.
                              super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4) =
                 fVar11;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)name_00);
            if (iVar4 == 0) {
              fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,name_00,0.0);
              *(float *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&local_178[2].super_Entity.
                                 super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->
                         _M_pi = fVar11;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)name_00);
              if (iVar4 == 0) {
                fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,name_00,0.0);
                *(float *)((long)&local_178[2].cameras.
                                  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                                  ._M_impl.super__Vector_impl_data + 0x10) = fVar11;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)name_00);
                if (iVar4 == 0) {
                  bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,name_00);
                  if (bVar3) {
                    *(undefined4 *)
                     &local_178[1].world.
                      super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         0x3f800000;
                    syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
                    findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
                    _Var8._M_pi = _Stack_160._M_pi;
                    peVar7 = local_168;
                    local_168 = (element_type *)0x0;
                    _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_178[2].super_Entity._vptr_Entity;
                    local_178[1].world.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
                    local_178[2].super_Entity._vptr_Entity = (_func_int **)_Var8._M_pi;
                    this_02 = (_Base_ptr)local_b0._8_8_;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       this_02 = (_Base_ptr)local_b0._8_8_,
                       (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (_Stack_160._M_pi);
                      this_02 = (_Base_ptr)local_b0._8_8_;
                    }
                    goto LAB_001427b5;
                  }
                  fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,name_00,0.0);
                  *(float *)&local_178[1].world.
                             super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       fVar11;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)name_00);
                  if (iVar4 == 0) {
                    syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
                    findOrCreateTexture((SemanticParser *)&local_168,(SP *)local_158._24_8_);
                    _Var8._M_pi = _Stack_160._M_pi;
                    peVar7 = local_168;
                    local_168 = (element_type *)0x0;
                    _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = local_178[2].integrator.
                             super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    local_178[2].integrator.
                    super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)peVar7;
                    local_178[2].integrator.
                    super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi = _Var8._M_pi;
                    this_02 = (_Base_ptr)local_c0._8_8_;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       this_02 = (_Base_ptr)local_c0._8_8_,
                       (element_type *)_Stack_160._M_pi != (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (_Stack_160._M_pi);
                      this_02 = (_Base_ptr)local_c0._8_8_;
                    }
                    goto LAB_001427b5;
                  }
                  iVar4 = std::__cxx11::string::compare((char *)name_00);
                  if (iVar4 != 0) {
                    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+(&local_e0,"un-handled uber-material parameter \'",
                                   &local_110.first);
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_e0);
                    local_168 = (element_type *)*plVar6;
                    peVar7 = (element_type *)(plVar6 + 2);
                    if (local_168 == peVar7) {
                      local_158._0_8_ = (peVar7->super_Entity)._vptr_Entity;
                      local_158._8_8_ = plVar6[3];
                      local_168 = (element_type *)local_158;
                    }
                    else {
                      local_158._0_8_ = (peVar7->super_Entity)._vptr_Entity;
                    }
                    _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
                    *plVar6 = (long)peVar7;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    std::runtime_error::runtime_error(prVar5,(string *)&local_168);
                    __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
              }
            }
          }
        }
      }
LAB_001427bf:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._40_8_ != &local_120) {
        operator_delete((void *)local_158._40_8_,local_120._M_allocated_capacity + 1);
      }
      if (local_110.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
        operator_delete(local_110.first._M_dataplus._M_p,
                        local_110.first.field_2._M_allocated_capacity + 1);
      }
      auVar12 = std::_Rb_tree_increment(p_Var10);
      _Var8._M_pi = auVar12._8_8_;
      p_Var10 = auVar12._0_8_;
    } while (p_Var10 != p_Var9);
  }
  (((SP *)local_158._32_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       local_178;
  (((SP *)local_158._32_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = p_Stack_170;
  SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_158._32_8_;
  return (SP)SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_uber(pbrt::syntactic::Material::SP in)
  {
    UberMaterial::SP mat = std::make_shared<UberMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "Kr") {
        if (in->hasParamTexture(name)) {
          mat->kr = vec3f(1.f);
          mat->map_kr = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kr.x,name);
      }
      else if (name == "Kt") {
        if (in->hasParamTexture(name)) {
          mat->kt = vec3f(1.f);
          mat->map_kt = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kt.x,name);
      }
      else if (name == "Ks") {
        if (in->hasParamTexture(name)) {
          mat->ks = vec3f(1.f);
          mat->map_ks = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->ks.x,name);
      }
      else if (name == "alpha") {
        if (in->hasParamTexture(name)) {
          mat->alpha = 1.f;
          mat->map_alpha = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->alpha = in->getParam1f(name);
      }
      else if (name == "opacity") {
        if (in->hasParamTexture(name)) {
          mat->opacity = vec3f(1.f);
          mat->map_opacity = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->opacity.x,name);
      }
      else if (name == "index") {
        mat->index = in->getParam1f(name);
      }
      else if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else if (in->hasParam1f(name))
          mat->roughness = in->getParam1f(name);
        else
          throw std::runtime_error("uber::roughness in un-recognized format...");
        // else
        //   in->getParam3f(&mat->roughness.x,name);
      }
      else if (name == "uroughness") {
        // if (in->hasParamTexture(name))
        //   mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        // else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        // if (in->hasParamTexture(name))
        //   mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        // else
          mat->vRoughness = in->getParam1f(name);
      }
      // else if (name == "remaproughness") {
      //   mat->remapRoughness = in->getParamBool(name);
      // }
      else if (name == "shadowalpha") {
        if (in->hasParamTexture(name)) {
          mat->shadowAlpha = 1.f;
          mat->map_shadowAlpha = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->shadowAlpha = in->getParam1f(name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled uber-material parameter '"+it.first+"'");
    };
    return mat;
  }